

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigproc.cc
# Opt level: O2

void sptk::snack::xhwindow(float *din,float *dout,int n,float preemp,int *wsizep,float **windp)

{
  double dVar1;
  double dVar2;
  float *__ptr;
  long lVar3;
  int iVar4;
  
  __ptr = *windp;
  if (*wsizep != n) {
    if (__ptr == (float *)0x0) {
      __ptr = (float *)malloc((long)n << 2);
    }
    else {
      __ptr = (float *)realloc(__ptr,(long)n << 2);
    }
    lVar3 = 0;
    iVar4 = 0;
    if (0 < n) {
      iVar4 = n;
    }
    dVar2 = 0.0;
    for (; iVar4 != (int)lVar3; lVar3 = lVar3 + 1) {
      dVar1 = cos((dVar2 + 0.5) * (6.2831854 / (double)n));
      __ptr[lVar3] = (float)(dVar1 * -0.46 + 0.54);
      dVar2 = dVar2 + 1.0;
    }
    *wsizep = n;
    *windp = __ptr;
  }
  if ((preemp != 0.0) || (NAN(preemp))) {
    for (lVar3 = 0; n != (int)lVar3; lVar3 = lVar3 + 1) {
      dout[lVar3] = (din[lVar3] * -preemp + din[lVar3 + 1]) * __ptr[lVar3];
    }
  }
  else {
    for (lVar3 = 0; n != (int)lVar3; lVar3 = lVar3 + 1) {
      dout[lVar3] = __ptr[lVar3] * din[lVar3];
    }
  }
  return;
}

Assistant:

void xhwindow(float *din, float *dout, int n, float preemp, int *wsizep,
              float **windp)
#endif
{
  register int i;
  register float *p;
#if 0
  static int wsize = 0;
  static float *wind=NULL;
#else
  int wsize = *wsizep;
  float *wind = *windp;
#endif
  register float *q;

  if(wsize != n) {		/* Need to create a new Hamming window? */
    register double arg, half=0.5;
    
    if(wind) wind = (float*)ckrealloc((void *)wind,n*sizeof(float));
    else wind = (float*)ckalloc(n*sizeof(float));
    wsize = n;
    for(i=0, arg=3.1415927*2.0/(wsize), q=wind; i < n; )
      *q++ = (float) (.54 - .46 * cos((half + (double)i++) * arg));
#if 1
    *wsizep = wsize;
    *windp = wind;
#endif
  }
/* If preemphasis is to be performed,  this assumes that there are n+1 valid
   samples in the input buffer (din). */
  if(preemp != 0.0) {
    for(i=n, p=din+1, q=wind; i--; )
      *dout++ = (float) (*q++ * ((float)(*p++) - (preemp * *din++)));
  } else {
    for(i=n, q=wind; i--; )
      *dout++ = *q++ * *din++;
  }
}